

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall zmq::stream_engine_base_t::zap_msg_available(stream_engine_base_t *this)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  int rc;
  stream_engine_base_t *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI[0xa8] == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1fc);
    fflush(_stderr);
    zmq_abort((char *)0x309070);
  }
  iVar2 = (**(code **)(*(long *)in_RDI[0xa8] + 0x30))();
  if (iVar2 == -1) {
    (**(code **)(*in_RDI + 0x60))(in_RDI,0);
  }
  else if ((((*(byte *)(in_RDI + 0xae) & 1) == 0) ||
           (bVar1 = restart_input(in_stack_00000038), bVar1)) &&
          ((*(byte *)((long)in_RDI + 0x571) & 1) != 0)) {
    restart_output((stream_engine_base_t *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void zmq::stream_engine_base_t::zap_msg_available ()
{
    zmq_assert (_mechanism != NULL);

    const int rc = _mechanism->zap_msg_available ();
    if (rc == -1) {
        error (protocol_error);
        return;
    }
    if (_input_stopped)
        if (!restart_input ())
            return;
    if (_output_stopped)
        restart_output ();
}